

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mrg_status<int,_3,_trng::mrg3> *S)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  int *in_RSI;
  istream *in_RDI;
  int i;
  fmtflags flags;
  mrg_status<int,_3,_trng::mrg3> S_new;
  delim_c *in_stack_ffffffffffffffa8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  istream *in_00;
  int local_28;
  mrg_status<int,_3,_trng::mrg3> local_1c;
  int *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_status<int,_3,_trng::mrg3>::mrg_status(&local_1c);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  utility::delim('\0');
  utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    std::istream::operator>>(local_8,local_1c.r + local_28);
    if (local_28 + 1 < 3) {
      utility::delim('\0');
      utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  in_00 = local_8;
  utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,
                      in_stack_ffffffffffffffa8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    *(undefined8 *)local_10 = local_1c.r._0_8_;
    local_10[2] = local_1c.r[2];
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return (basic_istream<char,_std::char_traits<char>_> *)local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_status &S) {
      mrg_status S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> S_new.r[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        S = S_new;
      in.flags(flags);
      return in;
    }